

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetTestsPropertiesCommand.h
# Opt level: O0

void __thiscall
cmSetTestsPropertiesCommand::~cmSetTestsPropertiesCommand(cmSetTestsPropertiesCommand *this)

{
  cmSetTestsPropertiesCommand *this_local;
  
  ~cmSetTestsPropertiesCommand(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE { return new cmSetTestsPropertiesCommand; }